

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWOImporter::LoadLWO2Clip(LWOImporter *this,uint length)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  short sVar3;
  ushort uVar4;
  pointer pCVar5;
  uint *puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint uVar8;
  long lVar9;
  Logger *pLVar10;
  uint8_t *puVar11;
  runtime_error *prVar12;
  uint uVar13;
  ushort uVar14;
  char *message;
  char *sz;
  bool bVar15;
  string s;
  ostringstream ss;
  char *local_1f0;
  long local_1e8;
  char local_1e0 [16];
  ulong local_1d0;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  Clip local_1a8 [2];
  ios_base local_138 [264];
  
  if (length < 10) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8[0]._0_8_ = (long)local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"LWO: CLIP chunk is too small","");
    std::runtime_error::runtime_error(prVar12,(string *)local_1a8);
    *(undefined ***)prVar12 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar7 = &local_1a8[0].path.field_2;
  local_1a8[0].type = 3;
  local_1a8[0].path._M_string_length = 0;
  local_1a8[0].path.field_2._M_local_buf[0] = '\0';
  local_1a8[0].clipRef = 0;
  local_1a8[0].idx = 0;
  local_1a8[0].negate = false;
  local_1a8[0].path._M_dataplus._M_p = (pointer)paVar7;
  std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>::
  emplace_back<Assimp::LWO::Clip>(&this->mClips,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].path._M_dataplus._M_p != paVar7) {
    operator_delete(local_1a8[0].path._M_dataplus._M_p);
  }
  pCVar5 = (this->mClips).super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar13 = *(uint *)this->mFileBuffer;
  this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 4);
  pCVar5[-1].idx =
       uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  puVar6 = (uint *)this->mFileBuffer;
  uVar13 = *puVar6;
  this->mFileBuffer = (uint8_t *)(puVar6 + 1);
  uVar4 = (ushort)puVar6[1];
  puVar1 = (uint8_t *)((long)puVar6 + 6);
  this->mFileBuffer = puVar1;
  uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  uVar14 = uVar4 << 8 | uVar4 >> 8;
  if ((int)uVar13 < 0x53544343) {
    if (uVar13 == 0x414e494d) {
      pLVar10 = DefaultLogger::get();
      message = "LWO2: Animated textures are not supported";
      goto LAB_0042c3d6;
    }
    if (uVar13 == 0x49534551) {
      if (uVar14 < 0x10) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1a8[0]._0_8_ = (long)local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"LWO: ISEQ chunk is too small","");
        std::runtime_error::runtime_error(prVar12,(string *)local_1a8);
        *(undefined ***)prVar12 = &PTR__runtime_error_00900168;
        __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      this->mFileBuffer = (uint8_t *)((long)puVar6 + 7);
      local_1d0 = (ulong)*(byte *)((long)puVar6 + 6);
      this->mFileBuffer = (uint8_t *)(puVar6 + 2);
      uVar8 = puVar6[2];
      this->mFileBuffer = (uint8_t *)((long)puVar6 + 0xe);
      uVar4 = *(ushort *)((long)puVar6 + 0xe);
      this->mFileBuffer = (uint8_t *)(puVar6 + 5);
      local_1f0 = local_1e0;
      local_1e8 = 0;
      local_1e0[0] = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      puVar1 = this->mFileBuffer;
      uVar2 = *puVar1;
      uVar13 = (uint)uVar14;
      puVar11 = puVar1;
      while (uVar2 != '\0') {
        puVar11 = puVar11 + 1;
        bVar15 = uVar13 == 0;
        uVar13 = uVar13 - 1;
        if (bVar15) {
          pLVar10 = DefaultLogger::get();
          Logger::warn(pLVar10,"LWO: Invalid file, string is is too long");
          break;
        }
        this->mFileBuffer = puVar11;
        uVar2 = *puVar11;
      }
      puVar11 = this->mFileBuffer;
      local_1c8[0] = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,puVar1,puVar11);
      std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1c8);
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0]);
      }
      lVar9 = local_1e8;
      this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar11 - (int)puVar1 & 1));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1f0,local_1e8);
      *(ulong *)((long)local_1a8 + *(long *)(local_1a8[0]._0_8_ + 0xffffffffffffffe8) + 0x10U) =
           local_1d0;
      std::ostream::operator<<
                (local_1a8,
                 (int)(short)(uVar4 << 8 | uVar4 >> 8) +
                 (int)(short)((ushort)uVar8 << 8 | (ushort)uVar8 >> 8));
      puVar1 = this->mFileBuffer;
      if (*puVar1 != '\0') {
        uVar13 = ~(uint)lVar9 + (uint)uVar14 & 0xffff;
        puVar11 = puVar1;
        do {
          puVar11 = puVar11 + 1;
          bVar15 = uVar13 == 0;
          uVar13 = uVar13 - 1;
          if (bVar15) {
            pLVar10 = DefaultLogger::get();
            Logger::warn(pLVar10,"LWO: Invalid file, string is is too long");
            break;
          }
          this->mFileBuffer = puVar11;
        } while (*puVar11 != '\0');
      }
      puVar11 = this->mFileBuffer;
      local_1c8[0] = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,puVar1,puVar11);
      std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1c8);
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0]);
      }
      this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar11 - (int)puVar1 & 1));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1f0,local_1e8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&pCVar5[-1].path,(string *)local_1c8);
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0]);
      }
      pCVar5[-1].type = SEQ;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if (local_1f0 == local_1e0) {
        return;
      }
      operator_delete(local_1f0);
      return;
    }
    if (uVar13 == 0x4e454741) {
      if (1 < uVar14) {
        sVar3 = *(short *)((long)puVar6 + 6);
        this->mFileBuffer = (uint8_t *)(puVar6 + 2);
        pCVar5[-1].negate = sVar3 != 0;
        return;
      }
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8[0]._0_8_ = (long)local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"LWO: NEGA chunk is too small","");
      std::runtime_error::runtime_error(prVar12,(string *)local_1a8);
      *(undefined ***)prVar12 = &PTR__runtime_error_00900168;
      __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (uVar13 == 0x53544343) {
      pLVar10 = DefaultLogger::get();
      message = "LWO2: Color shifted images are not supported";
      goto LAB_0042c3d6;
    }
    if (uVar13 == 0x5354494c) {
      if (uVar4 == 0) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1a8[0]._0_8_ = (long)local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"LWO: STIL chunk is too small","");
        std::runtime_error::runtime_error(prVar12,(string *)local_1a8);
        *(undefined ***)prVar12 = &PTR__runtime_error_00900168;
        __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (*puVar1 != '\0') {
        uVar13 = (uint)uVar14;
        puVar11 = (uint8_t *)((long)puVar6 + 7);
        do {
          bVar15 = uVar13 == 0;
          uVar13 = uVar13 - 1;
          if (bVar15) {
            pLVar10 = DefaultLogger::get();
            Logger::warn(pLVar10,"LWO: Invalid file, string is is too long");
            break;
          }
          this->mFileBuffer = puVar11;
          uVar2 = *puVar11;
          puVar11 = puVar11 + 1;
        } while (uVar2 != '\0');
      }
      puVar11 = this->mFileBuffer;
      local_1a8[0]._0_8_ = (void *)((long)local_1a8 + 0x10U);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,puVar1);
      std::__cxx11::string::operator=((string *)&pCVar5[-1].path,(string *)local_1a8);
      if ((void *)local_1a8[0]._0_8_ != (void *)((long)local_1a8 + 0x10U)) {
        operator_delete((void *)local_1a8[0]._0_8_);
      }
      this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar11 - (int)puVar1 & 1));
      pCVar5[-1].type = STILL;
      return;
    }
    if (uVar13 == 0x58524546) {
      if (3 < uVar14) {
        pCVar5[-1].type = REF;
        uVar13 = *(uint *)this->mFileBuffer;
        this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 4);
        pCVar5[-1].clipRef =
             uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
        return;
      }
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8[0]._0_8_ = (long)local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"LWO: XREF chunk is too small","");
      std::runtime_error::runtime_error(prVar12,(string *)local_1a8);
      *(undefined ***)prVar12 = &PTR__runtime_error_00900168;
      __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pLVar10 = DefaultLogger::get();
  message = "LWO2: Encountered unknown CLIP sub-chunk";
LAB_0042c3d6:
  Logger::warn(pLVar10,message);
  return;
}

Assistant:

void LWOImporter::LoadLWO2Clip(unsigned int length)
{
    AI_LWO_VALIDATE_CHUNK_LENGTH(length,CLIP,10);

    mClips.push_back(LWO::Clip());
    LWO::Clip& clip = mClips.back();

    // first - get the index of the clip
    clip.idx = GetU4();

    IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);
    switch (head.type)
    {
    case AI_LWO_STIL:
        AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,STIL,1);

        // "Normal" texture
        GetS0(clip.path,head.length);
        clip.type = Clip::STILL;
        break;

    case AI_LWO_ISEQ:
        AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,ISEQ,16);
        // Image sequence. We'll later take the first.
        {
            uint8_t digits = GetU1();  mFileBuffer++;
            int16_t offset = GetU2();  mFileBuffer+=4;
            int16_t start  = GetU2();  mFileBuffer+=4;

            std::string s;
            std::ostringstream ss;
            GetS0(s,head.length);

            head.length -= (uint16_t)s.length()+1;
            ss << s;
            ss << std::setw(digits) << offset + start;
            GetS0(s,head.length);
            ss << s;
            clip.path = ss.str();
            clip.type = Clip::SEQ;
        }
        break;

    case AI_LWO_STCC:
        ASSIMP_LOG_WARN("LWO2: Color shifted images are not supported");
        break;

    case AI_LWO_ANIM:
        ASSIMP_LOG_WARN("LWO2: Animated textures are not supported");
        break;

    case AI_LWO_XREF:
        AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,XREF,4);

        // Just a cross-reference to another CLIp
        clip.type = Clip::REF;
        clip.clipRef = GetU4();
        break;

    case AI_LWO_NEGA:
        AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,NEGA,2);
        clip.negate = (0 != GetU2());
        break;

    default:
        ASSIMP_LOG_WARN("LWO2: Encountered unknown CLIP sub-chunk");
    }
}